

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboMultisampleTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::BasicFboMultisampleCase::colorCompare
          (BasicFboMultisampleCase *this,Surface *reference,Surface *result)

{
  TestLog *log;
  bool bVar1;
  RGBA RVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  TextureFormat local_80;
  ConstPixelBufferAccess local_78;
  ConstPixelBufferAccess local_50;
  
  RVar2 = FboTestUtil::getFormatThreshold(this->m_colorFormat);
  uVar4 = RVar2.m_value & 0xff;
  if (uVar4 < 0xd) {
    uVar4 = 0xc;
  }
  uVar6 = RVar2.m_value >> 8 & 0xff;
  if (uVar6 < 0xd) {
    uVar6 = 0xc;
  }
  uVar5 = RVar2.m_value >> 0x10 & 0xff;
  if (uVar5 < 0xd) {
    uVar5 = 0xc;
  }
  uVar3 = RVar2.m_value >> 0x18;
  if (uVar3 < 0xd) {
    uVar3 = 0xc;
  }
  log = ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_78.m_format.order = RGBA;
  local_78.m_format.type = UNORM_INT8;
  pvVar7 = (void *)(reference->m_pixels).m_cap;
  if (pvVar7 != (void *)0x0) {
    pvVar7 = (reference->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_50,&local_78.m_format,reference->m_width,reference->m_height,1,pvVar7);
  local_80.order = RGBA;
  local_80.type = UNORM_INT8;
  pvVar7 = (void *)(result->m_pixels).m_cap;
  if (pvVar7 != (void *)0x0) {
    pvVar7 = (result->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_78,&local_80,result->m_width,result->m_height,1,pvVar7);
  bVar1 = tcu::bilinearCompare
                    (log,"Result","Image comparison result",&local_50,&local_78,
                     (RGBA)(uVar5 << 0x10 | uVar6 << 8 | uVar4 | uVar3 << 0x18),COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool colorCompare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::RGBA threshold (tcu::max(getFormatThreshold(m_colorFormat), tcu::RGBA(12, 12, 12, 12)));

		return tcu::bilinearCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);
	}